

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O2

void anon_unknown.dwarf_4f9a9::testMatrix(M44f *M)

{
  ostream *poVar1;
  float (*pafVar2) [4];
  long lVar3;
  long lVar4;
  V3f t;
  V3f r;
  V3f h;
  V3f s;
  M44f D;
  M44f N;
  
  Imath_2_5::extractSHRT<float>(M,&s,&h,&r,&t,true);
  N.x[1][3] = 0.0;
  N.x[2][0] = 0.0;
  N.x[2][3] = 0.0;
  N.x[3][0] = 0.0;
  N.x[0][1] = 0.0;
  N.x[0][2] = 0.0;
  N.x[0][3] = 0.0;
  N.x[1][0] = 0.0;
  N.x[3][1] = 0.0;
  N.x[3][2] = 0.0;
  N.x[0][0] = 1.0;
  N.x[1][1] = 1.0;
  N.x[1][2] = 0.0;
  N.x[2][1] = 0.0;
  N.x[2][2] = 1.0;
  N.x[3][3] = 1.0;
  Imath_2_5::Matrix44<float>::translate<float>(&N,&t);
  Imath_2_5::Matrix44<float>::rotate<float>(&N,&r);
  Imath_2_5::Matrix44<float>::shear<float>(&N,&h);
  Imath_2_5::Matrix44<float>::scale<float>(&N,&s);
  pafVar2 = (float (*) [4])&D;
  Imath_2_5::Matrix44<float>::operator-(M,&N);
  lVar4 = 0;
  do {
    if (lVar4 == 4) {
      return;
    }
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      if (1e-05 < ABS((*(float (*) [4])*pafVar2)[lVar3])) {
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*pafVar2)[lVar3]);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar4);
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar3);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar1 = Imath_2_5::operator<<(poVar1,M);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar1 = Imath_2_5::operator<<(poVar1,&N);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar1 = Imath_2_5::operator<<(poVar1,&D);
        std::endl<char,std::char_traits<char>>(poVar1);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                      ,0x118,"void (anonymous namespace)::testMatrix(const M44f)");
      }
    }
    lVar4 = lVar4 + 1;
    pafVar2 = pafVar2 + 1;
  } while( true );
}

Assistant:

void
testMatrix (const M44f M)
{
    //
    // Extract Euler angles from M, and convert the
    // Euler angles back to a matrix, N.
    //

    V3f s, h, r, t;
  
    extractSHRT (M, s, h, r, t, true);

    M44f N;

    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.shear (h);
    N.scale (s);

    debug (("Re-scale: %f %f %f\n", s[0], s[1], s[2]));
    debug (("Re-shear: %f %f %f\n", h[0], h[1], h[2]));
    debug (("Re-rot  : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Re-trans: %f %f %f\n", t[0], t[1], t[2]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M44f D (M - N);

    for (int j = 0; j < 4; ++j)
    {
	for (int k = 0; k < 4; ++k)
	{
	    if (abs (D[j][k]) > 0.00001)
	    {
		cout << "unexpectedly large matrix to "
			"euler angles conversion error: " <<
			D[j][k] << endl;

		cout << j << " " << k << endl;

		cout << "M\n" << M << endl;
		cout << "N\n" << N << endl;
		cout << "D\n" << D << endl;

		assert (false);
	    }
	}
    }
}